

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O1

string * pybind11::detail::error_string_abi_cxx11_(void)

{
  string *in_RDI;
  error_fetch_and_normalize local_50;
  
  error_fetch_and_normalize::error_fetch_and_normalize(&local_50,"pybind11::detail::error_string");
  error_fetch_and_normalize::error_string_abi_cxx11_(&local_50);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_lazy_error_string._M_dataplus._M_p != &local_50.m_lazy_error_string.field_2) {
    operator_delete(local_50.m_lazy_error_string._M_dataplus._M_p,
                    local_50.m_lazy_error_string.field_2._M_allocated_capacity + 1);
  }
  object::~object(&local_50.m_trace);
  object::~object(&local_50.m_value);
  object::~object(&local_50.m_type);
  return in_RDI;
}

Assistant:

inline std::string error_string() {
    return error_fetch_and_normalize("pybind11::detail::error_string").error_string();
}